

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

size_t nni_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  for (uVar2 = 0; uVar2 < in_len; uVar2 = uVar2 + 1) {
    uVar4 = uVar4 << 8 | (uint)in[uVar2];
    uVar5 = uVar5 + 8;
    while (5 < uVar5) {
      if (out_len <= uVar3) {
        return 0xffffffffffffffff;
      }
      out[uVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [uVar4 >> ((byte)(uVar5 - 6) & 0x1f) & 0x3f];
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 - 6;
    }
  }
  if (uVar5 == 0) goto LAB_00131ac3;
  if (uVar3 < out_len) {
    cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [uVar4 << (6U - (char)uVar5 & 0x1f) & 0x3f];
    do {
      out[uVar3] = cVar1;
      uVar3 = uVar3 + 1;
LAB_00131ac3:
      if ((uVar3 & 3) == 0) {
        if (out_len <= uVar3) {
          return 0xffffffffffffffff;
        }
        out[uVar3] = '\0';
        return uVar3;
      }
      cVar1 = '=';
    } while (uVar3 < out_len);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nni_base64_encode(const uint8_t *in, size_t in_len, char *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	size_t   io;

	const uint8_t encode[65] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
	                           "abcdefghijklmnopqrstuvwxyz"
	                           "0123456789+/";

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		uint8_t ch = in[ii];
		v          = (v << 8u) | ch;
		rem += 8;
		while (rem >= 6) {
			rem -= 6;
			if (io >= out_len)
				return (-1);
			out[io++] = encode[(v >> rem) & 63u];
		}
	}

	if (rem) {
		v <<= (6 - rem);
		if (io >= out_len)
			return (-1);
		out[io++] = encode[v & 63u];
	}

	// Pad to a multiple of 3.
	while (io & 3u) {
		if (io >= out_len)
			return (-1);
		out[io++] = '=';
	}

	if (io >= out_len)
		return (-1);

	out[io] = '\0';

	return (io);
}